

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void copy_suite::remove_copy(void)

{
  basic_iterator<int> first_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin;
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> __first;
  basic_iterator<int> __last;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  allocator_type local_c1;
  vector<int,_std::allocator<int>_> local_c0;
  circular_view<int,_18446744073709551615UL> *local_a8;
  size_type sStack_a0;
  int local_94 [3];
  undefined1 *local_88;
  long lStack_80;
  long local_78;
  ulong local_70;
  undefined1 local_68 [16];
  type local_58 [6];
  circular_view<int,_18446744073709551615UL> local_40;
  
  local_40.member.data = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_40.member.cap = 4;
  local_40.member.size = 0;
  local_40.member.next = 4;
  local_88 = (undefined1 *)0x160000000b;
  lStack_80 = 0x2c00000021;
  local_78 = CONCAT44(local_78._4_4_,0x37);
  input._M_len = 5;
  input._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_40,input);
  local_88 = local_68;
  lStack_80 = 4;
  local_78 = 0;
  local_70 = 4;
  uVar2 = local_40.member.cap * 2;
  if ((uVar2 & local_40.member.cap * 2 - 1) == 0) {
    uVar3 = local_40.member.next - local_40.member.size & uVar2 - 1;
    uVar2 = uVar2 - 1 & local_40.member.next;
  }
  else {
    uVar3 = (local_40.member.next - local_40.member.size) % uVar2;
    uVar2 = local_40.member.next % uVar2;
  }
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0x21;
  __first.current = uVar3;
  __first.parent = &local_40;
  __last.current = uVar2;
  __last.parent = &local_40;
  std::
  __remove_copy_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
            (__first,__last,(circular_view<int,_18446744073709551615UL> *)&local_88,
             (_Iter_equals_val<const_int>)&local_c0);
  local_94[0] = 0x16;
  local_94[1] = 0x2c;
  local_94[2] = 0x37;
  __l._M_len = 3;
  __l._M_array = local_94;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,__l,&local_c1);
  uVar2 = lStack_80 * 2;
  if ((uVar2 & lStack_80 * 2 - 1U) == 0) {
    uVar3 = local_70 - local_78 & uVar2 - 1;
    sStack_a0 = uVar2 - 1 & local_70;
  }
  else {
    uVar3 = (local_70 - local_78) % uVar2;
    sStack_a0 = local_70 % uVar2;
  }
  second_begin._M_current._4_4_ =
       local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin._M_current._0_4_ =
       local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  first_end.current = sStack_a0;
  first_end.parent = (circular_view<int,_18446744073709551615UL> *)&local_88;
  first_begin.current = uVar3;
  first_begin.parent = (circular_view<int,_18446744073709551615UL> *)&local_88;
  local_a8 = (circular_view<int,_18446744073709551615UL> *)&local_88;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x9c,"void copy_suite::remove_copy()",first_begin,first_end,second_begin,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  pvVar1 = (void *)CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  return;
}

Assistant:

void remove_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::remove_copy(span.begin(), span.end(), std::back_inserter(copy), 33);
    {
        std::vector<int> expect = { 22, 44, 55 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}